

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

string * __thiscall
vera::toString_abi_cxx11_
          (string *__return_storage_ptr__,vera *this,vec4 *_vec,char _sep,int _precision)

{
  char cVar1;
  _Setprecision _Var2;
  ostream *poVar3;
  undefined3 in_register_00000009;
  int __n;
  ostringstream local_198 [8];
  ostringstream strStream;
  int _precision_local;
  char _sep_local;
  vec4 *_vec_local;
  
  __n = CONCAT31(in_register_00000009,_sep);
  cVar1 = (char)_vec;
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar3 = (ostream *)std::ostream::operator<<(local_198,std::fixed);
  _Var2 = std::setprecision(__n);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(float *)this);
  std::operator<<(poVar3,cVar1);
  poVar3 = (ostream *)std::ostream::operator<<(local_198,std::fixed);
  _Var2 = std::setprecision(__n);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(float *)(this + 4));
  std::operator<<(poVar3,cVar1);
  poVar3 = (ostream *)std::ostream::operator<<(local_198,std::fixed);
  _Var2 = std::setprecision(__n);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(float *)(this + 8));
  std::operator<<(poVar3,cVar1);
  poVar3 = (ostream *)std::ostream::operator<<(local_198,std::fixed);
  _Var2 = std::setprecision(__n);
  poVar3 = std::operator<<(poVar3,_Var2);
  std::ostream::operator<<(poVar3,*(float *)(this + 0xc));
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(const glm::vec4& _vec, char _sep, int _precision) {
    std::ostringstream strStream;
    strStream << std::fixed << std::setprecision(_precision) << _vec.x << _sep;
    strStream << std::fixed << std::setprecision(_precision) << _vec.y << _sep;
    strStream << std::fixed << std::setprecision(_precision) << _vec.z << _sep; 
    strStream << std::fixed << std::setprecision(_precision) << _vec.w;
    return strStream.str();
}